

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_typeinfo.h
# Opt level: O3

bool __thiscall dukglue::detail::TypeInfo::can_cast<Dog>(TypeInfo *this)

{
  char *__s1;
  int iVar1;
  
  while( true ) {
    __s1 = *(char **)((this->index_)._M_target + 8);
    if (__s1 == "3Dog") {
      return true;
    }
    if ((*__s1 != '*') && (iVar1 = strcmp(__s1,"3Dog"), iVar1 == 0)) break;
    this = this->base_;
    if (this == (TypeInfo *)0x0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool can_cast() const {
				if (index_ == typeid(T))
					return true;

				if (base_)
					return base_->can_cast<T>();

				return false;
			}